

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_start_session(tclpkcs11_handle *handle,CK_SLOT_ID slot)

{
  CK_RV CVar1;
  long lVar2;
  CK_RV chk_rv;
  CK_SESSION_HANDLE tmp_session;
  CK_SLOT_ID slot_local;
  tclpkcs11_handle *handle_local;
  
  tmp_session = slot;
  slot_local = (CK_SLOT_ID)handle;
  if (handle->session_active != 0) {
    if (handle->session_slot == slot) {
      return 0;
    }
    handle->session_active = 0;
    CVar1 = (*handle->pkcs11->C_CloseSession)(handle->session);
    if (CVar1 != 0) {
      return (int)CVar1;
    }
  }
  lVar2 = (**(code **)(*(long *)(slot_local + 8) + 0x68))(tmp_session,6,0,0,&chk_rv);
  if (lVar2 == 0) {
    *(CK_RV *)(slot_local + 0x20) = chk_rv;
    *(CK_SESSION_HANDLE *)(slot_local + 0x18) = tmp_session;
    *(undefined4 *)(slot_local + 0x10) = 1;
    handle_local._4_4_ = 0;
  }
  else {
    (**(code **)(*(long *)(slot_local + 8) + 0x70))(*(undefined8 *)(slot_local + 0x20));
    handle_local._4_4_ = (int)lVar2;
  }
  return handle_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_start_session(struct tclpkcs11_handle *handle, CK_SLOT_ID slot) {
  CK_SESSION_HANDLE tmp_session;
  CK_RV chk_rv;

  if (handle->session_active) {
    if (handle->session_slot == slot) {
      return(CKR_OK);
    }

    /* Close the existing session and create a new one */
    handle->session_active = 0;
    chk_rv = handle->pkcs11->C_CloseSession(handle->session);
    if (chk_rv != CKR_OK) {
      return(chk_rv);
    }
  }

  /*LISSI*/
  /*	chk_rv = handle->pkcs11->C_OpenSession(slot, CKF_SERIAL_SESSION, NULL, NULL, &tmp_session);*/
  chk_rv = handle->pkcs11->C_OpenSession(slot, CKF_RW_SESSION | CKF_SERIAL_SESSION, NULL, NULL, &tmp_session);

  if (chk_rv != CKR_OK) {
    handle->pkcs11->C_CloseSession(handle->session);

    return(chk_rv);
  }

  handle->session = tmp_session;
  handle->session_slot = slot;
  handle->session_active = 1;

  return(CKR_OK);
}